

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O3

void __thiscall spvtools::opt::IRContext::BuildStructuredCFGAnalysis(IRContext *this)

{
  byte *pbVar1;
  StructuredCFGAnalysis *__ptr;
  StructuredCFGAnalysis *this_00;
  
  this_00 = (StructuredCFGAnalysis *)operator_new(0x58);
  StructuredCFGAnalysis::StructuredCFGAnalysis(this_00,this);
  __ptr = (this->struct_cfg_analysis_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
          .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl;
  (this->struct_cfg_analysis_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
  .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl = this_00;
  if (__ptr != (StructuredCFGAnalysis *)0x0) {
    std::default_delete<spvtools::opt::StructuredCFGAnalysis>::operator()
              ((default_delete<spvtools::opt::StructuredCFGAnalysis> *)&this->struct_cfg_analysis_,
               __ptr);
  }
  pbVar1 = (byte *)((long)&this->valid_analyses_ + 1);
  *pbVar1 = *pbVar1 | 8;
  return;
}

Assistant:

void BuildStructuredCFGAnalysis() {
    struct_cfg_analysis_ = MakeUnique<StructuredCFGAnalysis>(this);
    valid_analyses_ = valid_analyses_ | kAnalysisStructuredCFG;
  }